

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.cpp
# Opt level: O3

string * __thiscall DateTime::getTimestamp_abi_cxx11_(string *__return_storage_ptr__,DateTime *this)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  string *psVar5;
  uint uVar6;
  long *plVar7;
  undefined8 *puVar8;
  uint uVar9;
  ulong *puVar10;
  char *pcVar11;
  size_type *psVar12;
  ulong uVar13;
  uint uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_6;
  string mer;
  string __str_4;
  string str;
  string __str_3;
  string __str_2;
  string __str_1;
  string __str_5;
  string __str;
  undefined8 *local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 uStack_220;
  ulong *local_218;
  long local_210;
  ulong local_208;
  long lStack_200;
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8 [2];
  ulong *local_1d8;
  long local_1d0;
  ulong local_1c8;
  long lStack_1c0;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8;
  long lStack_1a0;
  ulong *local_198;
  long local_190;
  ulong local_188;
  long lStack_180;
  ulong *local_178;
  long local_170;
  ulong local_168;
  long lStack_160;
  undefined8 *local_158;
  long local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  ulong *local_138;
  long local_130;
  ulong local_128 [2];
  ulong *local_118;
  long local_110;
  ulong local_108 [2];
  ulong *local_f8;
  long local_f0;
  ulong local_e8 [2];
  undefined8 *local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  string *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar2 = this->date;
  uVar3 = -uVar2;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar14 = 1;
  if (9 < uVar3) {
    uVar13 = (ulong)uVar3;
    uVar6 = 4;
    do {
      uVar14 = uVar6;
      uVar9 = (uint)uVar13;
      if (uVar9 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_0011060f;
      }
      if (uVar9 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_0011060f;
      }
      if (uVar9 < 10000) goto LAB_0011060f;
      uVar13 = uVar13 / 10000;
      uVar6 = uVar14 + 4;
    } while (99999 < uVar9);
    uVar14 = uVar14 + 1;
  }
LAB_0011060f:
  local_50[0] = local_40;
  local_58 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)uVar14 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + (uVar2 >> 0x1f),uVar14,uVar3);
  plVar7 = (long *)std::__cxx11::string::append((char *)local_50);
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_1c8 = *puVar10;
    lStack_1c0 = plVar7[3];
    local_1d8 = &local_1c8;
  }
  else {
    local_1c8 = *puVar10;
    local_1d8 = (ulong *)*plVar7;
  }
  local_1d0 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar2 = this->month;
  uVar3 = -uVar2;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar14 = 1;
  if (9 < uVar3) {
    uVar13 = (ulong)uVar3;
    uVar6 = 4;
    do {
      uVar14 = uVar6;
      uVar9 = (uint)uVar13;
      if (uVar9 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_001106fe;
      }
      if (uVar9 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_001106fe;
      }
      if (uVar9 < 10000) goto LAB_001106fe;
      uVar13 = uVar13 / 10000;
      uVar6 = uVar14 + 4;
    } while (99999 < uVar9);
    uVar14 = uVar14 + 1;
  }
LAB_001106fe:
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct((ulong)&local_f8,(char)uVar14 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_f8),uVar14,uVar3);
  uVar13 = 0xf;
  if (local_1d8 != &local_1c8) {
    uVar13 = local_1c8;
  }
  if (uVar13 < (ulong)(local_f0 + local_1d0)) {
    uVar13 = 0xf;
    if (local_f8 != local_e8) {
      uVar13 = local_e8[0];
    }
    if (uVar13 < (ulong)(local_f0 + local_1d0)) goto LAB_00110782;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_1d8);
  }
  else {
LAB_00110782:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_f8);
  }
  local_d8 = &local_c8;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_c8 = *puVar1;
    uStack_c0 = puVar8[3];
  }
  else {
    local_c8 = *puVar1;
    local_d8 = (undefined8 *)*puVar8;
  }
  local_d0 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d8);
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_1a8 = *puVar10;
    lStack_1a0 = plVar7[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *puVar10;
    local_1b8 = (ulong *)*plVar7;
  }
  local_1b0 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar2 = this->year;
  uVar3 = -uVar2;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar14 = 1;
  if (9 < uVar3) {
    uVar13 = (ulong)uVar3;
    uVar6 = 4;
    do {
      uVar14 = uVar6;
      uVar9 = (uint)uVar13;
      if (uVar9 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_001108b8;
      }
      if (uVar9 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_001108b8;
      }
      if (uVar9 < 10000) goto LAB_001108b8;
      uVar13 = uVar13 / 10000;
      uVar6 = uVar14 + 4;
    } while (99999 < uVar9);
    uVar14 = uVar14 + 1;
  }
LAB_001108b8:
  local_118 = local_108;
  std::__cxx11::string::_M_construct((ulong)&local_118,(char)uVar14 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_118),uVar14,uVar3);
  uVar13 = 0xf;
  if (local_1b8 != &local_1a8) {
    uVar13 = local_1a8;
  }
  if (uVar13 < (ulong)(local_110 + local_1b0)) {
    uVar13 = 0xf;
    if (local_118 != local_108) {
      uVar13 = local_108[0];
    }
    if (uVar13 < (ulong)(local_110 + local_1b0)) goto LAB_00110945;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_1b8);
  }
  else {
LAB_00110945:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_118);
  }
  local_b8 = &local_a8;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_a8 = *puVar1;
    uStack_a0 = puVar8[3];
  }
  else {
    local_a8 = *puVar1;
    local_b8 = (undefined8 *)*puVar8;
  }
  local_b0 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_b8);
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_188 = *puVar10;
    lStack_180 = plVar7[3];
    local_198 = &local_188;
  }
  else {
    local_188 = *puVar10;
    local_198 = (ulong *)*plVar7;
  }
  local_190 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar2 = this->hour;
  uVar3 = -uVar2;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar14 = 1;
  if (9 < uVar3) {
    uVar13 = (ulong)uVar3;
    uVar6 = 4;
    do {
      uVar14 = uVar6;
      uVar9 = (uint)uVar13;
      if (uVar9 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_00110a7e;
      }
      if (uVar9 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_00110a7e;
      }
      if (uVar9 < 10000) goto LAB_00110a7e;
      uVar13 = uVar13 / 10000;
      uVar6 = uVar14 + 4;
    } while (99999 < uVar9);
    uVar14 = uVar14 + 1;
  }
LAB_00110a7e:
  local_138 = local_128;
  std::__cxx11::string::_M_construct((ulong)&local_138,(char)uVar14 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_138),uVar14,uVar3);
  uVar13 = 0xf;
  if (local_198 != &local_188) {
    uVar13 = local_188;
  }
  if (uVar13 < (ulong)(local_130 + local_190)) {
    uVar13 = 0xf;
    if (local_138 != local_128) {
      uVar13 = local_128[0];
    }
    if (uVar13 < (ulong)(local_130 + local_190)) goto LAB_00110b0b;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,(ulong)local_198);
  }
  else {
LAB_00110b0b:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_138);
  }
  local_98 = &local_88;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_88 = *puVar1;
    uStack_80 = puVar8[3];
  }
  else {
    local_88 = *puVar1;
    local_98 = (undefined8 *)*puVar8;
  }
  local_90 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_168 = *puVar10;
    lStack_160 = plVar7[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *puVar10;
    local_178 = (ulong *)*plVar7;
  }
  local_170 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar2 = this->minute;
  uVar3 = -uVar2;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar14 = 1;
  if (9 < uVar3) {
    uVar13 = (ulong)uVar3;
    uVar6 = 4;
    do {
      uVar14 = uVar6;
      uVar9 = (uint)uVar13;
      if (uVar9 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_00110c44;
      }
      if (uVar9 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_00110c44;
      }
      if (uVar9 < 10000) goto LAB_00110c44;
      uVar13 = uVar13 / 10000;
      uVar6 = uVar14 + 4;
    } while (99999 < uVar9);
    uVar14 = uVar14 + 1;
  }
LAB_00110c44:
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct((ulong)&local_1f8,(char)uVar14 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_1f8),uVar14,uVar3);
  uVar13 = 0xf;
  if (local_178 != &local_168) {
    uVar13 = local_168;
  }
  if (uVar13 < (ulong)(local_1f0 + local_170)) {
    uVar13 = 0xf;
    if (local_1f8 != local_1e8) {
      uVar13 = local_1e8[0];
    }
    if (uVar13 < (ulong)(local_1f0 + local_170)) goto LAB_00110cc4;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,(ulong)local_178);
  }
  else {
LAB_00110cc4:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_1f8);
  }
  local_238 = &local_228;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_228 = *puVar1;
    uStack_220 = puVar8[3];
  }
  else {
    local_228 = *puVar1;
    local_238 = (undefined8 *)*puVar8;
  }
  local_230 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_238);
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_208 = *puVar10;
    lStack_200 = plVar7[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *puVar10;
    local_218 = (ulong *)*plVar7;
  }
  local_210 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar2 = this->second;
  uVar3 = -uVar2;
  if (0 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar14 = 1;
  if (9 < uVar3) {
    uVar13 = (ulong)uVar3;
    uVar6 = 4;
    do {
      uVar14 = uVar6;
      uVar9 = (uint)uVar13;
      if (uVar9 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_00110de2;
      }
      if (uVar9 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_00110de2;
      }
      if (uVar9 < 10000) goto LAB_00110de2;
      uVar13 = uVar13 / 10000;
      uVar6 = uVar14 + 4;
    } while (99999 < uVar9);
    uVar14 = uVar14 + 1;
  }
LAB_00110de2:
  local_78 = local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)uVar14 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_78),uVar14,uVar3);
  uVar13 = 0xf;
  if (local_218 != &local_208) {
    uVar13 = local_208;
  }
  if (uVar13 < (ulong)(local_70 + local_210)) {
    uVar13 = 0xf;
    if (local_78 != local_68) {
      uVar13 = local_68[0];
    }
    if ((ulong)(local_70 + local_210) <= uVar13) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_218);
      goto LAB_00110e83;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_78);
LAB_00110e83:
  local_158 = &local_148;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_148 = *puVar1;
    uStack_140 = puVar8[3];
  }
  else {
    local_148 = *puVar1;
    local_158 = (undefined8 *)*puVar8;
  }
  local_150 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_138 != local_128) {
    operator_delete(local_138);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8);
  }
  if (local_118 != local_108) {
    operator_delete(local_118);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  local_210 = 0;
  local_208 = local_208 & 0xffffffffffffff00;
  pcVar11 = "PM";
  if (this->meridy == 'A') {
    pcVar11 = "AM";
  }
  local_218 = &local_208;
  std::__cxx11::string::_M_replace((ulong)&local_218,0,(char *)0x0,(ulong)pcVar11);
  local_238 = &local_228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,local_158,(undefined1 *)(local_150 + (long)local_158));
  psVar5 = local_58;
  std::__cxx11::string::append((char *)&local_238);
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_218);
  (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
  psVar12 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar12) {
    lVar4 = plVar7[3];
    (psVar5->field_2)._M_allocated_capacity = *psVar12;
    *(long *)((long)&psVar5->field_2 + 8) = lVar4;
  }
  else {
    (psVar5->_M_dataplus)._M_p = (pointer)*plVar7;
    (psVar5->field_2)._M_allocated_capacity = *psVar12;
  }
  psVar5->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_238 != &local_228) {
    operator_delete(local_238);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  return psVar5;
}

Assistant:

string DateTime::getTimestamp() const {
    string str = to_string(date) + "/" + to_string(month) + "/" + to_string(year) + " " + to_string(hour) + ":" +
                 to_string(minute) + ":" + to_string(second);
    string mer;
    if (meridy == 'A') mer = "AM";
    else mer = "PM";
    return str + " " + mer;
}